

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform_data.h
# Opt level: O0

void __thiscall
draco::AttributeTransformData::SetParameterValue<int>
          (AttributeTransformData *this,int byte_offset,int *in_data)

{
  DataBuffer *this_00;
  DataBuffer *pDVar1;
  int64_t in_RDX;
  int in_ESI;
  size_t in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = (DataBuffer *)((long)in_ESI + 4);
  pDVar1 = (DataBuffer *)DataBuffer::data_size((DataBuffer *)0x2a1782);
  if (pDVar1 < this_00) {
    DataBuffer::Resize(this_00,in_RDI);
  }
  DataBuffer::Write((DataBuffer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,this_00,in_RDI);
  return;
}

Assistant:

void SetParameterValue(int byte_offset, const DataTypeT &in_data) {
    if (byte_offset + sizeof(DataTypeT) > buffer_.data_size()) {
      buffer_.Resize(byte_offset + sizeof(DataTypeT));
    }
    buffer_.Write(byte_offset, &in_data, sizeof(DataTypeT));
  }